

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_private.hpp
# Opt level: O1

void __thiscall Infector::Container::wire<ComfortableBed>(Container *this)

{
  unordered_map<std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>_>
  *this_00;
  size_t *psVar1;
  iterator iVar2;
  iterator iVar3;
  mapped_type *this_01;
  _Node *p_Var4;
  mapped_type *this_02;
  undefined8 *puVar5;
  key_type local_38;
  key_type local_30;
  
  local_38._M_target = (type_info *)&ComfortableBed::typeinfo;
  iVar2 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->callbacks)._M_h,&local_38);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    this_00 = &this->recursionMap;
    local_38._M_target = (type_info *)&ComfortableBed::typeinfo;
    iVar3 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,&local_38);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_30._M_target = (type_info *)&ComfortableBed::typeinfo;
      local_38._M_target = (type_info *)this;
      this_01 = std::__detail::
                _Map_base<std::type_index,_std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,&local_30);
      std::function<bool(Infector::RecursionLimit*,int*)>::operator=
                ((function<bool(Infector::RecursionLimit*,int*)> *)this_01,
                 (anon_class_8_1_8991fb9c *)&local_38);
      local_38._M_target = (type_info *)&ComfortableBed::typeinfo;
      iVar3 = std::
              _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,&local_38);
      p_Var4 = std::__cxx11::
               list<std::function<bool(Infector::RecursionLimit*,int*)>,std::allocator<std::function<bool(Infector::RecursionLimit*,int*)>>>
               ::_M_create_node<std::function<bool(Infector::RecursionLimit*,int*)>const&>
                         ((list<std::function<bool(Infector::RecursionLimit*,int*)>,std::allocator<std::function<bool(Infector::RecursionLimit*,int*)>>>
                           *)&this->recursionWaitList,
                          (function<bool_(Infector::RecursionLimit_*,_int_*)> *)
                          ((long)iVar3.
                                 super__Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
                                 ._M_cur + 0x10));
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      psVar1 = &(this->recursionWaitList).
                super__List_base<std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::allocator<std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    processRecursionWeb<Infector::DummyClass>(this);
    local_30._M_target = (type_info *)&ComfortableBed::typeinfo;
    local_38._M_target = (type_info *)this;
    this_02 = std::__detail::
              _Map_base<std::type_index,_std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->callbacks,&local_30);
    std::function<void*(Infector::Container::EmplaceContext*)>::operator=
              ((function<void*(Infector::Container::EmplaceContext*)> *)this_02,
               (anon_class_8_1_8991fb9c *)&local_38);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = &PTR__exception_001825b8;
  __cxa_throw(puVar5,&ExWireAgain::typeinfo,std::exception::~exception);
}

Assistant:

void Container::wire(){
        bool tests = reduced_type_tests<T>();
        (void) tests; //fix unused variable warning

        auto it2 = callbacks.find(std::type_index(typeid(T)));
        if( it2!=callbacks.end())
            launch_exception<ExWireAgain>();

        auto it3 = recursionMap.find(std::type_index(typeid(T)));
        if( it3==recursionMap.end()){
            recursionMap[std::type_index(typeid(T))] =
                    [this] (RecursionLimit *limit, int *size){
                        (*size)+= sizeof(T);
                        bool result =
                            tryToGetSize<Dependencies...
                                        ,DummyClass>(limit,size);

                        return result;
                    }; //now the function exist.
            it3 = recursionMap.find(std::type_index(typeid(T)));
            recursionWaitList.push_back(it3->second);
        }

        processRecursionWeb(); //do lots of checks during "wire"
                               //find errors early!

        // THROW... ok exception safe! Indipendently of parameters order
        callbacks[std::type_index(typeid(T))] =
                    [this] (EmplaceContext * context) {
                        (void)context; //fix unused parameter warning.
                        return reinterpret_cast<void*>(
                            new T(UniqueOrShared<Dependencies>(this,context)...)
                        );
                    };
    }